

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadBlockMap(MapData *map)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  DWORD DVar4;
  int iVar5;
  short *buffer;
  ulong uVar6;
  uint local_34;
  int local_2c;
  short t;
  int i;
  short *wadblockmaplump;
  BYTE *data;
  int count;
  MapData *map_local;
  
  DVar4 = MapData::Size(map,10);
  if (((((ForceNodeBuild & 1U) != 0) ||
       (bVar3 = FBoolCVar::operator_cast_to_bool(&genblockmap), bVar3)) || (0xffff < (int)DVar4 / 2)
      ) || ((DVar4 == 0 || (iVar5 = DArgs::CheckParm(Args,"-blockmap",1), iVar5 != 0)))) {
    DPrintf(4,"Generating BLOCKMAP\n");
    P_CreateBlockMap();
  }
  else {
    buffer = (short *)operator_new__((long)(int)DVar4);
    MapData::Read(map,10,buffer,-1);
    iVar5 = (int)DVar4 / 2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar5;
    uVar6 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    blockmaplump = (int *)operator_new__(uVar6);
    *blockmaplump = (int)*buffer;
    blockmaplump[1] = (int)buffer[1];
    blockmaplump[2] = (uint)(ushort)buffer[2];
    blockmaplump[3] = (uint)(ushort)buffer[3];
    for (local_2c = 4; local_2c < iVar5; local_2c = local_2c + 1) {
      if (buffer[local_2c] == 0xffff) {
        local_34 = 0xffffffff;
      }
      else {
        local_34 = (uint)(ushort)buffer[local_2c];
      }
      blockmaplump[local_2c] = local_34;
    }
    if (buffer != (short *)0x0) {
      operator_delete__(buffer);
    }
    bVar3 = P_VerifyBlockMap(iVar5);
    if (!bVar3) {
      DPrintf(4,"Generating BLOCKMAP\n");
      P_CreateBlockMap();
    }
  }
  bmaporgx = (double)*blockmaplump;
  bmaporgy = (double)blockmaplump[1];
  bmapwidth = blockmaplump[2];
  bmapheight = blockmaplump[3];
  iVar5 = bmapwidth * bmapheight;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  blocklinks = (FBlockNode **)operator_new__(uVar6);
  memset(blocklinks,0,(long)iVar5 << 3);
  blockmap = blockmaplump + 4;
  return;
}

Assistant:

void P_LoadBlockMap (MapData * map)
{
	int count = map->Size(ML_BLOCKMAP);

	if (ForceNodeBuild || genblockmap ||
		count/2 >= 0x10000 || count == 0 ||
		Args->CheckParm("-blockmap")
		)
	{
		DPrintf (DMSG_SPAMMY, "Generating BLOCKMAP\n");
		P_CreateBlockMap ();
	}
	else
	{
		BYTE *data = new BYTE[count];
		map->Read(ML_BLOCKMAP, data);
		const short *wadblockmaplump = (short *)data;
		int i;

		count/=2;
		blockmaplump = new int[count];

		// killough 3/1/98: Expand wad blockmap into larger internal one,
		// by treating all offsets except -1 as unsigned and zero-extending
		// them. This potentially doubles the size of blockmaps allowed,
		// because Doom originally considered the offsets as always signed.

		blockmaplump[0] = LittleShort(wadblockmaplump[0]);
		blockmaplump[1] = LittleShort(wadblockmaplump[1]);
		blockmaplump[2] = (DWORD)(LittleShort(wadblockmaplump[2])) & 0xffff;
		blockmaplump[3] = (DWORD)(LittleShort(wadblockmaplump[3])) & 0xffff;

		for (i = 4; i < count; i++)
		{
			short t = LittleShort(wadblockmaplump[i]);          // killough 3/1/98
			blockmaplump[i] = t == -1 ? (DWORD)0xffffffff : (DWORD) t & 0xffff;
		}
		delete[] data;

		if (!P_VerifyBlockMap(count))
		{
			DPrintf (DMSG_SPAMMY, "Generating BLOCKMAP\n");
			P_CreateBlockMap();
		}

	}

	bmaporgx = blockmaplump[0];
	bmaporgy = blockmaplump[1];
	bmapwidth = blockmaplump[2];
	bmapheight = blockmaplump[3];

	// clear out mobj chains
	count = bmapwidth*bmapheight;
	blocklinks = new FBlockNode *[count];
	memset (blocklinks, 0, count*sizeof(*blocklinks));
	blockmap = blockmaplump+4;
}